

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.c
# Opt level: O0

SqQueue EnQueue2(SqQueue Q,ElementType e)

{
  SqQueue SVar1;
  ElementType e_local;
  SqQueue Q_local;
  
  Q_local.base._0_4_ = Q.front;
  if (((int)Q_local.base + 1) % 100 == (int)Q_local.base) {
    printf(anon_var_dwarf_a3);
  }
  Q_local.base._4_4_ = Q.rear;
  Q.base[Q_local.base._4_4_] = e;
  Q_local.base = (ElementType *)
                 CONCAT44(Q_local.base._4_4_ + 1 + ((Q_local.base._4_4_ + 1) / 100) * -100,
                          (int)Q_local.base);
  printf(anon_var_dwarf_6d);
  SVar1._8_8_ = Q_local.base;
  SVar1.base = Q.base;
  return SVar1;
}

Assistant:

SqQueue EnQueue2(SqQueue Q,ElementType e){
    if((Q.front + 1) % MAXQSIZE == Q.front){
        printf("队列已满");
    }
    Q.base[Q.rear] = e;
    Q.rear = (Q.rear + 1) % MAXQSIZE;
    printf("成功插入元素\n");
    return Q;
}